

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O0

void __thiscall
bk_lib::left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::
try_shrink(left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U> *this
          )

{
  buf_type *pbVar1;
  bool bVar2;
  size_type sVar3;
  uint uVar4;
  buf_type *pbVar5;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *plVar6;
  buf_type *pbVar7;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *in_RDI;
  size_type r;
  size_type c;
  buf_type *e;
  left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
  *in_stack_ffffffffffffffb0;
  
  sVar3 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
          raw_size(in_RDI);
  if (sVar3 < 0x21) {
    pbVar1 = in_RDI->buf_;
    pbVar5 = detail::
             with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>::
             extra((with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>
                    *)in_RDI);
    if (pbVar1 != pbVar5) {
      plVar6 = (left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_> *)
               detail::
               with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>::
               extra((with_inline_buffer<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_32U>
                      *)in_RDI);
      sVar3 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
              right_size(in_RDI);
      uVar4 = sVar3 * -8 + 0x20;
      bVar2 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
              empty(in_RDI);
      if (!bVar2) {
        in_stack_ffffffffffffffb0 = plVar6;
        pbVar7 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                 ::begin(in_RDI);
        sVar3 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
                left_size(in_RDI);
        memcpy(in_stack_ffffffffffffffb0,pbVar7,(ulong)sVar3 << 2);
        pbVar7 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>
                 ::right(in_RDI);
        sVar3 = detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::
                right_size(in_RDI);
        memcpy((buf_type *)((long)&plVar6->buf_ + (ulong)uVar4),pbVar7,(ulong)sVar3 << 3);
      }
      detail::left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>::release
                (in_stack_ffffffffffffffb0);
      in_RDI->buf_ = (buf_type *)plVar6;
      *(uint *)&in_RDI->field_0x8 = *(uint *)&in_RDI->field_0x8 & 0x80000000 | 0x20;
      *(uint *)&in_RDI->field_0x8 = *(uint *)&in_RDI->field_0x8 & 0x7fffffff;
      in_RDI->right_ = uVar4;
    }
  }
  return;
}

Assistant:

void try_shrink() {
		if (this->raw_size() <= base_type::inline_raw_cap && this->buf_ != this->extra()) {
			buf_type* e = this->extra();
			size_type c = base_type::inline_raw_cap;
			size_type r = c - (this->right_size()*sizeof(right_type));
			if (!this->empty()) {
				std::memcpy(e,   this->begin(), this->left_size() * sizeof(left_type));
				std::memcpy(e+r, this->right(), this->right_size()* sizeof(right_type));
			}
			this->release();
			this->buf_  = e;
			this->cap_  = c;
			this->free_ = 0;
			this->right_= r;
		}
	}